

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateBaseClass.cpp
# Opt level: O2

void __thiscall
vkt::DynamicState::DynamicStateBaseClass::initPipeline(DynamicStateBaseClass *this,VkDevice device)

{
  DeviceInterface *pDVar1;
  StencilOpState _front;
  StencilOpState _back;
  ProgramBinary *pPVar2;
  allocator_type local_46d;
  value_type_conflict2 local_46c;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_468;
  undefined1 local_448 [24];
  VkShaderModule VStack_430;
  undefined1 local_428 [24];
  _Vector_base<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
  local_410 [2];
  _Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_> local_3d8;
  _Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_> local_3c0;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_3a8;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_388;
  VkStencilOpState local_368;
  VkStencilOpState local_348;
  Attachment vkCbAttachmentState;
  PipelineCreateInfo pipelineCreateInfo;
  
  pDVar1 = this->m_vk;
  pPVar2 = ::vk::ProgramCollection<vk::ProgramBinary>::get
                     (((this->super_TestInstance).m_context)->m_progCollection,
                      &this->m_vertexShaderName);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&pipelineCreateInfo,pDVar1,device,pPVar2,0);
  local_388.m_data.deleter.m_device =
       (VkDevice)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._16_8_;
  local_388.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages;
  local_388.m_data.object.m_internal = pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_;
  local_388.m_data.deleter.m_deviceIface =
       (DeviceInterface *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._4_4_ = 0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext = (void *)0x0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.flags = 0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.stageCount = 0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages =
       (VkPipelineShaderStageCreateInfo *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&pipelineCreateInfo);
  pDVar1 = this->m_vk;
  pPVar2 = ::vk::ProgramCollection<vk::ProgramBinary>::get
                     (((this->super_TestInstance).m_context)->m_progCollection,
                      &this->m_fragmentShaderName);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&pipelineCreateInfo,pDVar1,device,pPVar2,0);
  local_3a8.m_data.deleter.m_device =
       (VkDevice)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._16_8_;
  local_3a8.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages;
  local_3a8.m_data.object.m_internal = pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_;
  local_3a8.m_data.deleter.m_deviceIface =
       (DeviceInterface *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._4_4_ = 0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext = (void *)0x0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.flags = 0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.stageCount = 0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages =
       (VkPipelineShaderStageCreateInfo *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&pipelineCreateInfo);
  Draw::PipelineCreateInfo::ColorBlendState::Attachment::Attachment
            (&vkCbAttachmentState,0,VK_BLEND_FACTOR_SRC_COLOR,VK_BLEND_FACTOR_DST_COLOR,
             VK_BLEND_OP_ADD,VK_BLEND_FACTOR_SRC_COLOR,VK_BLEND_FACTOR_DST_COLOR,VK_BLEND_OP_ADD,0xf
            );
  Draw::PipelineCreateInfo::PipelineCreateInfo
            (&pipelineCreateInfo,
             (VkPipelineLayout)
             (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
             m_internal,
             (VkRenderPass)
             (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
             m_internal,0,0);
  Draw::PipelineCreateInfo::PipelineShaderStage::PipelineShaderStage
            ((PipelineShaderStage *)local_448,(VkShaderModule)local_388.m_data.object.m_internal,
             "main",VK_SHADER_STAGE_VERTEX_BIT);
  Draw::PipelineCreateInfo::addShader
            (&pipelineCreateInfo,(VkPipelineShaderStageCreateInfo *)local_448);
  Draw::PipelineCreateInfo::PipelineShaderStage::PipelineShaderStage
            ((PipelineShaderStage *)local_448,(VkShaderModule)local_3a8.m_data.object.m_internal,
             "main",VK_SHADER_STAGE_FRAGMENT_BIT);
  Draw::PipelineCreateInfo::addShader
            (&pipelineCreateInfo,(VkPipelineShaderStageCreateInfo *)local_448);
  local_448._0_4_ = (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.sType;
  local_448._4_4_ =
       *(undefined4 *)
        &(this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.field_0x4;
  local_448._8_8_ = (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.pNext;
  local_448._16_4_ = (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.flags;
  local_448._20_4_ =
       (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.
       vertexBindingDescriptionCount;
  VStack_430.m_internal =
       (deUint64)
       (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.
       pVertexBindingDescriptions;
  local_428._0_8_ =
       *(undefined8 *)
        &(this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.
         vertexAttributeDescriptionCount;
  local_428._8_8_ =
       (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.
       pVertexAttributeDescriptions;
  Draw::PipelineCreateInfo::addState
            (&pipelineCreateInfo,(VkPipelineVertexInputStateCreateInfo *)local_448);
  Draw::PipelineCreateInfo::InputAssemblerState::InputAssemblerState
            ((InputAssemblerState *)local_448,this->m_topology,0);
  Draw::PipelineCreateInfo::addState
            (&pipelineCreateInfo,(VkPipelineInputAssemblyStateCreateInfo *)local_448);
  Draw::PipelineCreateInfo::ColorBlendState::ColorBlendState
            ((ColorBlendState *)local_448,1,
             &vkCbAttachmentState.super_VkPipelineColorBlendAttachmentState,0,VK_LOGIC_OP_COPY);
  Draw::PipelineCreateInfo::addState
            (&pipelineCreateInfo,(VkPipelineColorBlendStateCreateInfo *)local_448);
  std::
  _Vector_base<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
  ::~_Vector_base(local_410);
  std::vector<vk::VkViewport,_std::allocator<vk::VkViewport>_>::vector
            ((vector<vk::VkViewport,_std::allocator<vk::VkViewport>_> *)&local_3c0,0,
             (allocator_type *)&local_468);
  std::vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>::vector
            ((vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_> *)&local_3d8,0,
             (allocator_type *)&local_46c);
  Draw::PipelineCreateInfo::ViewportState::ViewportState
            ((ViewportState *)local_448,1,
             (vector<vk::VkViewport,_std::allocator<vk::VkViewport>_> *)&local_3c0,
             (vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_> *)&local_3d8);
  Draw::PipelineCreateInfo::addState
            (&pipelineCreateInfo,(VkPipelineViewportStateCreateInfo *)local_448);
  Draw::PipelineCreateInfo::ViewportState::~ViewportState((ViewportState *)local_448);
  std::_Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>::~_Vector_base(&local_3d8);
  std::_Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>::~_Vector_base(&local_3c0);
  Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
            ((StencilOpState *)&local_348,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
             VK_STENCIL_OP_REPLACE,VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,0);
  Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
            ((StencilOpState *)&local_368,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
             VK_STENCIL_OP_REPLACE,VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,0);
  _front.super_VkStencilOpState.depthFailOp = local_348.depthFailOp;
  _front.super_VkStencilOpState.failOp = local_348.failOp;
  _front.super_VkStencilOpState.passOp = local_348.passOp;
  _front.super_VkStencilOpState.compareOp = local_348.compareOp;
  _front.super_VkStencilOpState.compareMask = local_348.compareMask;
  _front.super_VkStencilOpState.writeMask = local_348.writeMask;
  _front.super_VkStencilOpState.reference = local_348.reference;
  _back.super_VkStencilOpState.depthFailOp = local_368.depthFailOp;
  _back.super_VkStencilOpState.failOp = local_368.failOp;
  _back.super_VkStencilOpState.passOp = local_368.passOp;
  _back.super_VkStencilOpState.compareOp = local_368.compareOp;
  _back.super_VkStencilOpState.compareMask = local_368.compareMask;
  _back.super_VkStencilOpState.writeMask = local_368.writeMask;
  _back.super_VkStencilOpState.reference = local_368.reference;
  Draw::PipelineCreateInfo::DepthStencilState::DepthStencilState
            ((DepthStencilState *)local_448,0,0,VK_COMPARE_OP_ALWAYS,0,0,_front,_back,0.0,1.0);
  Draw::PipelineCreateInfo::addState
            (&pipelineCreateInfo,(VkPipelineDepthStencilStateCreateInfo *)local_448);
  Draw::PipelineCreateInfo::RasterizerState::RasterizerState
            ((RasterizerState *)local_448,0,0,VK_POLYGON_MODE_FILL,0,VK_FRONT_FACE_CLOCKWISE,1,0.0,
             0.0,0.0,1.0);
  Draw::PipelineCreateInfo::addState
            (&pipelineCreateInfo,(VkPipelineRasterizationStateCreateInfo *)local_448);
  local_46c = 0xffffffff;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_468,1,&local_46c,
             &local_46d);
  Draw::PipelineCreateInfo::MultiSampleState::MultiSampleState
            ((MultiSampleState *)local_448,VK_SAMPLE_COUNT_1_BIT,0,0.0,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_468,false,false);
  Draw::PipelineCreateInfo::addState
            (&pipelineCreateInfo,(VkPipelineMultisampleStateCreateInfo *)local_448);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)(local_428 + 0x10));
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_468);
  std::vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>::vector
            ((vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_> *)&local_468,0,
             (allocator_type *)&local_46c);
  Draw::PipelineCreateInfo::DynamicState::DynamicState
            ((DynamicState *)local_448,
             (vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_> *)&local_468);
  Draw::PipelineCreateInfo::addState
            (&pipelineCreateInfo,(VkPipelineDynamicStateCreateInfo *)local_448);
  std::_Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>::~_Vector_base
            ((_Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_> *)local_428);
  std::_Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>::~_Vector_base
            ((_Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_> *)&local_468);
  ::vk::createGraphicsPipeline
            ((Move<vk::Handle<(vk::HandleType)18>_> *)&local_468,this->m_vk,device,
             (VkPipelineCache)0x0,&pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo,
             (VkAllocationCallbacks *)0x0);
  local_448._16_8_ = local_468.m_data.deleter.m_device;
  VStack_430.m_internal = (deUint64)local_468.m_data.deleter.m_allocator;
  local_448._0_8_ = local_468.m_data.object.m_internal;
  local_448._8_8_ = local_468.m_data.deleter.m_deviceIface;
  local_468.m_data.object.m_internal = 0;
  local_468.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_468.m_data.deleter.m_device = (VkDevice)0x0;
  local_468.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::reset
            (&(this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>);
  (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
       (VkDevice)local_448._16_8_;
  (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)VStack_430.m_internal;
  (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
       local_448._0_8_;
  (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)local_448._8_8_;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_468);
  Draw::PipelineCreateInfo::~PipelineCreateInfo(&pipelineCreateInfo);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_3a8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_388);
  return;
}

Assistant:

void DynamicStateBaseClass::initPipeline (const vk::VkDevice device)
{
	const vk::Unique<vk::VkShaderModule> vs(createShaderModule(m_vk, device, m_context.getBinaryCollection().get(m_vertexShaderName), 0));
	const vk::Unique<vk::VkShaderModule> fs(createShaderModule(m_vk, device, m_context.getBinaryCollection().get(m_fragmentShaderName), 0));

	const PipelineCreateInfo::ColorBlendState::Attachment vkCbAttachmentState;

	PipelineCreateInfo pipelineCreateInfo(*m_pipelineLayout, *m_renderPass, 0, 0);
	pipelineCreateInfo.addShader(PipelineCreateInfo::PipelineShaderStage(*vs, "main", vk::VK_SHADER_STAGE_VERTEX_BIT));
	pipelineCreateInfo.addShader(PipelineCreateInfo::PipelineShaderStage(*fs, "main", vk::VK_SHADER_STAGE_FRAGMENT_BIT));
	pipelineCreateInfo.addState(PipelineCreateInfo::VertexInputState(m_vertexInputState));
	pipelineCreateInfo.addState(PipelineCreateInfo::InputAssemblerState(m_topology));
	pipelineCreateInfo.addState(PipelineCreateInfo::ColorBlendState(1, &vkCbAttachmentState));
	pipelineCreateInfo.addState(PipelineCreateInfo::ViewportState(1));
	pipelineCreateInfo.addState(PipelineCreateInfo::DepthStencilState());
	pipelineCreateInfo.addState(PipelineCreateInfo::RasterizerState());
	pipelineCreateInfo.addState(PipelineCreateInfo::MultiSampleState());
	pipelineCreateInfo.addState(PipelineCreateInfo::DynamicState());

	m_pipeline = vk::createGraphicsPipeline(m_vk, device, DE_NULL, &pipelineCreateInfo);
}